

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O0

void __thiscall ncnn::Gemm_x86_avx::Gemm_x86_avx(Gemm_x86_avx *this)

{
  long *in_RDI;
  Gemm *in_stack_ffffffffffffff98;
  
  Gemm::Gemm(in_stack_ffffffffffffff98);
  *in_RDI = (long)&PTR_create_pipeline_01d3c1b0;
  in_RDI[0x1d] = (long)&PTR__Gemm_x86_avx_01d3c228;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  in_RDI[6] = 0;
  *(undefined4 *)(in_RDI + 7) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  *(undefined4 *)(in_RDI + 9) = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  *(undefined4 *)(in_RDI + 0xe) = 0;
  in_RDI[0xf] = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  *(undefined4 *)((long)in_RDI + 0x84) = 0;
  *(undefined4 *)(in_RDI + 0x11) = 0;
  *(undefined4 *)((long)in_RDI + 0x8c) = 0;
  *(undefined4 *)(in_RDI + 0x12) = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0;
  in_RDI[0x16] = 0;
  *(undefined4 *)(in_RDI + 0x17) = 0;
  in_RDI[0x18] = 0;
  *(undefined4 *)(in_RDI + 0x19) = 0;
  *(undefined4 *)((long)in_RDI + 0xcc) = 0;
  *(undefined4 *)(in_RDI + 0x1a) = 0;
  *(undefined4 *)((long)in_RDI + 0xd4) = 0;
  *(undefined4 *)(in_RDI + 0x1b) = 0;
  in_RDI[0x1c] = 0;
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb) = 1;
  *(undefined4 *)(in_RDI + 1) = 0;
  return;
}

Assistant:

Gemm_x86_avx::Gemm_x86_avx()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    nT = 0;
}